

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

AWeapon * __thiscall FWeaponSlots::PickNextWeapon(FWeaponSlots *this,player_t *player)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  AWeapon *this_00;
  uint uVar5;
  uint uVar6;
  PClassWeapon *type;
  int startindex;
  int startslot;
  uint local_44;
  int local_40;
  uint local_3c;
  FWeaponSlots *local_38;
  
  if (player->mo == (APlayerPawn *)0x0) {
    return (AWeapon *)0x0;
  }
  if (player->ReadyWeapon == (AWeapon *)0x0) {
LAB_00618e8e:
    local_40 = 9;
    local_44 = this->Slots[9].Weapons.Count - 1;
  }
  else {
    bVar3 = FindMostRecentWeapon(player,&local_40,(int *)&local_44);
    if (!bVar3) goto LAB_00618f7b;
    if (player->ReadyWeapon == (AWeapon *)0x0) goto LAB_00618e8e;
  }
  local_3c = 0;
  iVar4 = local_40;
  uVar6 = local_44;
  local_38 = this;
  do {
    while( true ) {
      uVar5 = uVar6 + 1;
      iVar2 = iVar4 + 1;
      if (8 < iVar4) {
        iVar2 = 0;
      }
      uVar1 = local_38->Slots[iVar4].Weapons.Count;
      uVar6 = 0;
      if ((int)uVar5 < (int)uVar1) {
        uVar6 = uVar5;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
      if (uVar6 < local_38->Slots[iVar4].Weapons.Count) {
        type = local_38->Slots[iVar4].Weapons.Array[(int)uVar6].Type;
      }
      else {
        type = (PClassWeapon *)0x0;
      }
      this_00 = (AWeapon *)
                AActor::FindInventory(&player->mo->super_AActor,(PClassActor *)type,false);
      if ((this_00 != (AWeapon *)0x0) &&
         (bVar3 = AWeapon::CheckAmmo(this_00,2,false,false,-1), bVar3)) {
        return this_00;
      }
      local_3c = local_3c + ((int)uVar1 <= (int)uVar5);
      if (iVar4 != local_40) break;
      if ((uVar6 == local_44) || (10 < local_3c)) goto LAB_00618f7b;
    }
  } while (local_3c < 0xb);
LAB_00618f7b:
  return player->ReadyWeapon;
}

Assistant:

AWeapon *FWeaponSlots::PickNextWeapon(player_t *player)
{
	int startslot, startindex;
	int slotschecked = 0;

	if (player->mo == NULL)
	{
		return NULL;
	}
	if (player->ReadyWeapon == NULL || FindMostRecentWeapon(player, &startslot, &startindex))
	{
		int slot;
		int index;

		if (player->ReadyWeapon == NULL)
		{
			startslot = NUM_WEAPON_SLOTS - 1;
			startindex = Slots[startslot].Size() - 1;
		}

		slot = startslot;
		index = startindex;
		do
		{
			if (++index >= Slots[slot].Size())
			{
				index = 0;
				slotschecked++;
				if (++slot >= NUM_WEAPON_SLOTS)
				{
					slot = 0;
				}
			}
			PClassWeapon *type = Slots[slot].GetWeapon(index);
			AWeapon *weap = static_cast<AWeapon *>(player->mo->FindInventory(type));
			if (weap != NULL && weap->CheckAmmo(AWeapon::EitherFire, false))
			{
				return weap;
			}
		}
		while ((slot != startslot || index != startindex) && slotschecked <= NUM_WEAPON_SLOTS);
	}
	return player->ReadyWeapon;
}